

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintFanio(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  uint local_48;
  int fVerbose;
  int fMffc;
  int fUseCone;
  int fUseSupp;
  int fUsePio;
  int fUseFanio;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fUseSupp = 0;
  fUseCone = 0;
  fMffc = 0;
  fVerbose = 0;
  local_48 = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_00262df1:
  iVar2 = Extra_UtilGetopt(argc,argv,"fiscmvh");
  if (iVar2 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if ((local_48 == 0) && (bVar1)) {
        if (fUseSupp + fUseCone + fMffc + fVerbose == 1) {
          Abc_NtkPrintFanio(_stdout,pNtk_00,fUseSupp,fUseCone,fMffc,fVerbose);
        }
        else {
          printf("Exactly one of the switches \"-f\", \"-i\", \"-s\", \"-c\" should be enabled.\n");
        }
      }
      else {
        Abc_NtkPrintFanioNew(_stdout,pNtk_00,local_48);
      }
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 99:
    fVerbose = fVerbose ^ 1;
    goto LAB_00262df1;
  default:
    break;
  case 0x66:
    fUseSupp = fUseSupp ^ 1;
    goto LAB_00262df1;
  case 0x68:
    break;
  case 0x69:
    fUseCone = fUseCone ^ 1;
    goto LAB_00262df1;
  case 0x6d:
    local_48 = local_48 ^ 1;
    goto LAB_00262df1;
  case 0x73:
    fMffc = fMffc ^ 1;
    goto LAB_00262df1;
  case 0x76:
    goto switchD_00262e2f_caseD_76;
  }
  Abc_Print(-2,"usage: print_fanio [-fiscmvh]\n");
  Abc_Print(-2,"\t        prints the statistics about different objects in the network\n");
  pcVar3 = "no";
  if (fUseSupp != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-f    : toggles considering fanins/fanouts of all nodes [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fUseCone != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-i    : toggles considering fanins/fanouts of CI/CO [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fMffc != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-s    : toggles considering TFO/TFI support sizes of CI/CO [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-c    : toggles considering TFO/TFI cone sizes of CI/CO [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_48 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-m    : toggles printing MFFC sizes instead of fanouts [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v    : toggles verbose way of printing the stats [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_00262e2f_caseD_76:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_00262df1;
}

Assistant:

int Abc_CommandPrintFanio( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseFanio = 0;
    int fUsePio   = 0;
    int fUseSupp  = 0;
    int fUseCone  = 0;
    int fMffc     = 0;
    int fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fiscmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fUseFanio ^= 1;
            break;
        case 'i':
            fUsePio ^= 1;
            break;
        case 's':
            fUseSupp ^= 1;
            break;
        case 'c':
            fUseCone ^= 1;
            break;
        case 'm':
            fMffc ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // print the nodes
    if ( fMffc || !fVerbose )
        Abc_NtkPrintFanioNew( stdout, pNtk, fMffc );
    else
    {
        if ( fUseFanio + fUsePio + fUseSupp + fUseCone == 1 )
            Abc_NtkPrintFanio( stdout, pNtk, fUseFanio, fUsePio, fUseSupp, fUseCone );
        else
            printf( "Exactly one of the switches \"-f\", \"-i\", \"-s\", \"-c\" should be enabled.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_fanio [-fiscmvh]\n" );
    Abc_Print( -2, "\t        prints the statistics about different objects in the network\n" );
    Abc_Print( -2, "\t-f    : toggles considering fanins/fanouts of all nodes [default = %s]\n", fUseFanio? "yes": "no" );
    Abc_Print( -2, "\t-i    : toggles considering fanins/fanouts of CI/CO [default = %s]\n", fUsePio? "yes": "no" );
    Abc_Print( -2, "\t-s    : toggles considering TFO/TFI support sizes of CI/CO [default = %s]\n", fUseSupp? "yes": "no" );
    Abc_Print( -2, "\t-c    : toggles considering TFO/TFI cone sizes of CI/CO [default = %s]\n", fUseCone? "yes": "no" );
    Abc_Print( -2, "\t-m    : toggles printing MFFC sizes instead of fanouts [default = %s]\n", fMffc? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggles verbose way of printing the stats [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}